

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfok.c
# Opt level: O3

err_t pfokMTI(octet *sharekey,pfok_params *params,octet *privkey,octet *privkey1,octet *pubkey,
             octet *pubkey1)

{
  u64 *dest;
  u64 *dest_00;
  u64 *dest_01;
  qr_o *r;
  bool_t bVar1;
  int iVar2;
  ulong uVar3;
  ulong m;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  u64 *dest_02;
  void *stack;
  word wVar7;
  ulong uVar8;
  err_t eVar9;
  ulong count;
  ulong n;
  
  bVar1 = memIsValid(params,0x2f8);
  eVar9 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = pfokParamsIsOperable(params);
    if (bVar1 == 0) {
      eVar9 = 0x1f6;
    }
    else {
      sVar4 = params->l;
      sVar5 = params->r;
      uVar8 = sVar5 + 7 >> 3;
      bVar1 = memIsValid(privkey,uVar8);
      if (bVar1 != 0) {
        bVar1 = memIsValid(privkey1,uVar8);
        if (bVar1 != 0) {
          count = sVar4 + 7 >> 3;
          bVar1 = memIsValid(pubkey,count);
          if (bVar1 != 0) {
            bVar1 = memIsValid(pubkey1,count);
            if (bVar1 != 0) {
              bVar1 = memIsValid(sharekey,params->n + 7 >> 3);
              if (bVar1 != 0) {
                n = sVar4 + 0x3f >> 6;
                uVar3 = sVar5 + 0x3f;
                m = uVar3 >> 6;
                sVar4 = zmMontCreate_keep(count);
                sVar5 = zmMontCreate_deep(count);
                sVar6 = zmMontCreate_deep(count);
                sVar6 = qrPower_deep(n,n,sVar6);
                sVar5 = utilMax(2,sVar5,sVar6);
                dest_02 = (u64 *)blobCreate((m + n) * 0x10 + sVar4 + sVar5);
                if (dest_02 == (u64 *)0x0) {
                  eVar9 = 0x6e;
                }
                else {
                  dest = dest_02 + m;
                  dest_00 = dest + m;
                  dest_01 = dest_00 + n;
                  r = (qr_o *)(dest_01 + n);
                  sVar4 = zmMontCreate_keep(count);
                  stack = (void *)((long)&(r->hdr).keep + sVar4);
                  zmMontCreate(r,params->p,count,params->l + 2,stack);
                  u64From(dest_02,privkey,uVar8);
                  u64From(dest,privkey1,uVar8);
                  uVar3 = uVar3 & 0xffffffffffffffc0;
                  wVar7 = wwGetBits(dest_02,params->r,uVar3 - params->r);
                  eVar9 = 0x1f8;
                  if (wVar7 == 0) {
                    wVar7 = wwGetBits(dest,params->r,uVar3 - params->r);
                    if (wVar7 == 0) {
                      u64From(dest_00,pubkey,count);
                      u64From(dest_01,pubkey1,count);
                      bVar1 = wwIsZero(dest_00,n);
                      eVar9 = 0x1f9;
                      if (bVar1 == 0) {
                        iVar2 = wwCmp(dest_00,r->mod,n);
                        if (iVar2 < 0) {
                          bVar1 = wwIsZero(dest_01,n);
                          if (bVar1 == 0) {
                            iVar2 = wwCmp(dest_01,(word *)dest_01[n + 3],n);
                            if (iVar2 < 0) {
                              qrPower(dest_00,dest_00,dest,m,r,stack);
                              qrPower(dest_01,dest_01,dest_02,m,r,stack);
                              (*r->to)((octet *)dest_00,dest_00,r,stack);
                              (*r->to)((octet *)dest_01,dest_01,r,stack);
                              memCopy(sharekey,dest_00,params->n + 7 >> 3);
                              memXor2(sharekey,dest_01,params->n + 7 >> 3);
                              uVar8 = params->n & 7;
                              eVar9 = 0;
                              if (uVar8 != 0) {
                                sharekey[params->n >> 3] =
                                     sharekey[params->n >> 3] &
                                     (byte)(0xff >> (8U - (char)uVar8 & 0x1f));
                                eVar9 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  blobClose(dest_02);
                }
              }
            }
          }
        }
      }
    }
  }
  return eVar9;
}

Assistant:

err_t pfokMTI(octet sharekey[], const pfok_params* params, 
	const octet privkey[], const octet privkey1[], 
	const octet pubkey[], const octet pubkey1[])
{
	size_t n, no;
	size_t m, mo;
	// состояние
	void* state;
	word* x;				/* [m] личный ключ */
	word* u;				/* [m] одноразовый личный ключ */
	word* y;				/* [n] открытый ключ визави */
	word* v;				/* [n] одноразовый открытый ключ визави */
	qr_o* qr;				/* описание кольца Монтгомери */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(pfok_params)))
		return ERR_BAD_INPUT;
	// работоспособные параметры?
	if (!pfokParamsIsOperable(params))
		return ERR_BAD_PARAMS;
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	// проверить остальные входные данные
	if (!memIsValid(privkey, mo) || 
		!memIsValid(privkey1, mo) || 
		!memIsValid(pubkey, no) ||
		!memIsValid(pubkey1, no) ||
		!memIsValid(sharekey, O_OF_B(params->n)))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(
		2 * O_OF_W(n) + 2 * O_OF_W(m) + zmMontCreate_keep(no) +  
		utilMax(2,
			zmMontCreate_deep(no),
			qrPower_deep(n, n, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	x = (word*)state;
	u = x + m;
	y = u + m;
	v = y + n;
	qr = (qr_o*)(v + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// x <- privkey, u <- privkey1
	wwFrom(x, privkey, mo);
	wwFrom(u, privkey1, mo);
	if (wwGetBits(x, params->r, B_OF_W(m) - params->r) != 0 ||
		wwGetBits(u, params->r, B_OF_W(m) - params->r) != 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// y <- pubkey, v <- pubkey1
	wwFrom(y, pubkey, no);
	wwFrom(v, pubkey1, no);
	if (wwIsZero(y, n) || wwCmp(y, qr->mod, n) >= 0 ||
		wwIsZero(v, n) || wwCmp(v, qr->mod, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// y <- y^u, v <- v^x
	qrPower(y, y, u, m, qr, stack);
	qrPower(v, v, x, m, qr, stack);
	// выгрузить открытый ключ
	qrTo((octet*)y, y, qr, stack);
	qrTo((octet*)v, v, qr, stack);
	memCopy(sharekey, y, O_OF_B(params->n));
	memXor2(sharekey, v, O_OF_B(params->n));
	if (params->n % 8)
		sharekey[params->n / 8] &= (octet)255 >> (8 - params->n % 8);
	// все нормально
	blobClose(state);
	return ERR_OK;
}